

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

void __thiscall
SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::Clear
          (SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
           *this)

{
  NoCheckHeapAllocator *this_00;
  SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount> *pSVar1;
  SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount> *buffer;
  
  this_00 = this->allocator;
  buffer = (SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount> *)
           (this->
           super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
           ).super_SListNodeBase<Memory::NoCheckHeapAllocator>.next;
  while (buffer != this) {
    pSVar1 = (SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
              *)(buffer->
                super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                ).super_SListNodeBase<Memory::NoCheckHeapAllocator>.next;
    Memory::NoCheckHeapAllocator::Free(this_00,buffer,0x18);
    buffer = pSVar1;
  }
  (this->
  super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>).
  super_SListNodeBase<Memory::NoCheckHeapAllocator>.next = (Type)this;
  (this->
  super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>).
  super_RealCount.count = 0;
  return;
}

Assistant:

void Clear()
    {
        __super::Clear(allocator);
    }